

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QCursor __thiscall QGraphicsItem::cursor(QGraphicsItem *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QGraphicsItemPrivate::extra(&QStack_38,*(QGraphicsItemPrivate **)(in_RSI + 8),ExtraCursor);
  qvariant_cast<QCursor>((QVariant *)this);
  ::QVariant::~QVariant(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QCursor)(QCursorData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QCursor QGraphicsItem::cursor() const
{
    return qvariant_cast<QCursor>(d_ptr->extra(QGraphicsItemPrivate::ExtraCursor));
}